

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCnst.cpp
# Opt level: O3

void __thiscall NaPNConstGen::NaPNConstGen(NaPNConstGen *this,char *szNodeName)

{
  NaPetriNode::NaPetriNode(&this->super_NaPetriNode,szNodeName);
  (this->super_NaPetriNode)._vptr_NaPetriNode = (_func_int **)&PTR__NaPNConstGen_001751b0;
  NaPetriCnOutput::NaPetriCnOutput(&this->out,&this->super_NaPetriNode,"out");
  this->nOutDim = 0;
  this->fConstVal = (NaReal *)0x0;
  (*(this->super_NaPetriNode)._vptr_NaPetriNode[0x15])(this,1);
  (*(this->super_NaPetriNode)._vptr_NaPetriNode[0x16])(0,this);
  return;
}

Assistant:

NaPNConstGen::NaPNConstGen (const char* szNodeName)
: NaPetriNode(szNodeName),
  nOutDim(0),
  fConstVal(NULL),
  ////////////////
  // Connectors //
  ////////////////
  out(this, "out")
{
    set_out_dim(1);
    set_const_value(0.0);
}